

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

void __thiscall
Centaurus::CATNMachine<unsigned_char>::print
          (CATNMachine<unsigned_char> *this,wostream *os,wstring *name)

{
  long *plVar1;
  wostream *pwVar2;
  pointer pCVar3;
  ulong uVar4;
  wchar_t wVar5;
  ulong uVar6;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar5 = (wchar_t)os;
      std::wostream::put(wVar5);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\" ];",0x1a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar5);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar5);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar5);
            std::wostream::flush();
            pCVar3 = (this->m_nodes).
                     super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_nodes).
                super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
              uVar6 = 0;
              do {
                CATNNode<unsigned_char>::print(pCVar3 + uVar6,os,(int)uVar6);
                pCVar3 = (this->m_nodes).
                         super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar6 = (ulong)((int)uVar6 + 1);
                uVar4 = ((long)(this->m_nodes).
                               super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 4) *
                        -0x3333333333333333;
              } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
            }
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar5);
              std::wostream::flush();
              return;
            }
          }
        }
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void print(std::wostream& os, const std::wstring& name) const
	{
		os << L"digraph " << name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_nodes.size(); i++)
		{
			m_nodes[i].print(os, i);
		}

		os << L"}" << std::endl;
	}